

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O2

bool __thiscall
HawkTracer::parser::ProtocolReader::_read_struct
          (ProtocolReader *this,FieldType *value,EventKlassField *field,Event *event,
          Event *base_event)

{
  KlassRegister *this_00;
  bool bVar1;
  Event *pEVar2;
  bool is_error;
  FieldType *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [24];
  undefined1 local_d0 [32];
  float local_b0;
  size_type local_a8;
  __pthread_internal_list _Stack_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  HT_TimestampNs local_88;
  Event local_80;
  
  local_110 = value;
  std::__cxx11::string::string((string *)local_d0,(string *)&field->_type_name);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d0,"HT_Event");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_108,(string *)field);
    bVar1 = std::operator==(&local_108,"base");
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)local_d0);
    if (bVar1) {
      if (this->_flat_events != false) {
        return true;
      }
      if (base_event != (Event *)0x0) {
        pEVar2 = (Event *)operator_new(0x50);
        Event::Event(pEVar2,base_event);
        local_110->f_EVENT = pEVar2;
        return true;
      }
      __assert_fail("base_event != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/protocol_reader.cpp"
                    ,0xdc,
                    "bool HawkTracer::parser::ProtocolReader::_read_struct(FieldType &, const EventKlassField &, Event *, Event *)"
                   );
    }
  }
  else {
    std::__cxx11::string::~string((string *)local_d0);
  }
  this_00 = this->_klass_register;
  std::__cxx11::string::string((string *)&local_108,(string *)&field->_type_name);
  KlassRegister::get_klass_id(this_00,&local_108);
  KlassRegister::get_klass((KlassRegister *)local_e8,(HT_EventKlassId)this_00);
  local_d0._0_8_ = &_Stack_a0;
  local_d0._8_8_ = (__pthread_internal_list *)0x1;
  local_d0._16_8_ = 0;
  local_d0._24_8_ = 0;
  local_b0 = 1.0;
  local_a8 = 0;
  _Stack_a0.__prev = (__pthread_internal_list *)0x0;
  _Stack_a0.__next = (__pthread_internal_list *)local_e8._0_8_;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
  local_e8._0_8_ = 0;
  local_e8._8_8_ = 0;
  local_88 = 0xffffffffffffffff;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
  std::__cxx11::string::~string((string *)&local_108);
  _read_event(this,&is_error,(Event *)local_d0,base_event);
  if (this->_flat_events == true) {
    Event::Event(&local_80,(Event *)local_d0);
    Event::merge(event,&local_80);
    Event::~Event(&local_80);
  }
  else {
    pEVar2 = (Event *)operator_new(0x50);
    Event::Event(pEVar2,(Event *)local_d0);
    local_110->f_EVENT = pEVar2;
  }
  Event::~Event((Event *)local_d0);
  return (bool)(is_error ^ 1);
}

Assistant:

bool ProtocolReader::_read_struct(FieldType& value, const EventKlassField& field, Event* event, Event* base_event)
{
    if (field.get_type_name() == "HT_Event" && field.get_name() == "base")
    {
        if (!_flat_events)
        {
            assert(base_event != nullptr);
            value.f_EVENT = new Event(std::move(*base_event));
        }
        return true;
    }
    else
    {
        bool is_error;
        Event sub_event(_klass_register->get_klass(_klass_register->get_klass_id(field.get_type_name())));
        _read_event(is_error, sub_event, base_event);
        if (_flat_events)
        {
            event->merge(std::move(sub_event));
        }
        else
        {
            value.f_EVENT = new Event(std::move(sub_event));
        }
        return !is_error;
    }
}